

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_rem_m68k(float128 a,float128 b,float_status *status)

{
  float128 fVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint32_t bLow;
  ulong uVar9;
  uint64_t aSig1;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  uint64_t bSig1;
  uint64_t bSig0;
  uint32_t aLow;
  int32_t bExp;
  int32_t aExp;
  uint64_t local_b8;
  ulong local_b0;
  ulong local_a8;
  uint64_t local_a0;
  ulong local_98;
  ulong local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float_status *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_a0 = b.low;
  aSig1 = a.low;
  uVar11 = a.high & 0xffffffffffff;
  local_84 = a.high._6_2_ & 0x7fff;
  local_98 = b.high & 0xffffffffffff;
  local_88 = b.high._6_2_ & 0x7fff;
  local_b0 = uVar11;
  local_b8 = aSig1;
  if (local_84 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
         aSig1 == 0) &&
       (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_a0 == 0 || local_88 != 0x7fff)) {
LAB_006ce2b4:
      status->float_exception_flags = status->float_exception_flags | 1;
      fVar1.high = 0x7fffffffffffffff;
      fVar1.low = 0xffffffffffffffff;
      return fVar1;
    }
LAB_006cdf5e:
    a = propagateFloat128NaN(a,b,status);
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_a0 == 0) goto LAB_006ce2b4;
      normalizeFloat128Subnormal(local_98,local_a0,(int32_t *)&local_88,&local_98,&local_a0);
    }
    else if (local_88 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          local_a0 == 0) {
        return a;
      }
      goto LAB_006cdf5e;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          aSig1 == 0) {
        return a;
      }
      normalizeFloat128Subnormal(uVar11,aSig1,(int32_t *)&local_84,&local_b0,&local_b8);
    }
    iVar5 = local_84 - local_88;
    if (-2 < iVar5) {
      local_74 = local_88;
      bVar3 = iVar5 == -1 ^ 0xf;
      uVar11 = local_b8 << bVar3;
      local_b0 = local_b8 >> ((iVar5 == -1) + 0x31U & 0x3f) | (local_b0 | 0x1000000000000) << bVar3;
      local_90 = local_a0 * 0x8000;
      local_98 = local_98 << 0xf;
      local_80 = local_98 | 0x8000000000000000;
      local_70 = local_a0 >> 0x31;
      local_a8 = local_70 + local_80;
      bVar13 = local_a8 <= local_b0;
      bVar14 = local_b0 == local_a8;
      local_b8 = uVar11;
      if (local_90 <= uVar11 && bVar14 || bVar13 && !bVar14) {
        local_b8 = uVar11 + local_a0 * -0x8000;
        local_b0 = (local_b0 - local_a8) - (ulong)(uVar11 < local_90);
      }
      iVar8 = iVar5 + -0x40;
      if (iVar5 < 0x41) {
        uVar11 = (ulong)(local_90 <= uVar11 && bVar14 || bVar13 && !bVar14);
      }
      else {
        uVar10 = local_80 >> 0x20;
        local_60 = local_98 & 0xffffffff00000000 | 0x8000000000000000;
        local_58 = local_a8 & 0xffffffff;
        local_40 = local_90 >> 0x20;
        local_48 = local_90 & 0xffffffff;
        iVar5 = iVar8;
        do {
          local_38 = local_b8;
          uVar9 = 0xffffffffffffffff;
          if (local_b0 < local_a8) {
            uVar11 = 0xffffffff00000000;
            if (local_b0 < local_60) {
              uVar11 = local_b0 / uVar10 << 0x20;
            }
            uVar2 = (uVar11 >> 0x20) * local_58;
            uVar12 = uVar11 * local_a8;
            uVar9 = local_38 - uVar12;
            lVar6 = ((local_b0 - ((uVar2 >> 0x20) + uVar10 * (uVar11 >> 0x20))) -
                    (ulong)(local_38 < uVar12)) - (ulong)(uVar12 < uVar2 << 0x20);
            if (lVar6 < 0) {
              uVar2 = (0x100000000 - uVar11) * local_a8 + local_38;
              uVar12 = uVar9;
              do {
                uVar11 = uVar11 - 0x100000000;
                uVar9 = uVar12 + (local_a8 << 0x20);
                bVar13 = uVar2 < uVar12;
                uVar2 = uVar2 + (local_a8 << 0x20);
                lVar6 = lVar6 + uVar10 + (ulong)bVar13;
                uVar12 = uVar9;
              } while (lVar6 < 0);
            }
            uVar9 = uVar9 >> 0x20 | lVar6 << 0x20;
            if (uVar9 < local_60) {
              uVar9 = uVar9 / uVar10;
            }
            else {
              uVar9 = 0xffffffff;
            }
            uVar9 = uVar9 | uVar11;
          }
          uVar11 = uVar9 - 4;
          if (uVar9 < 4) {
            uVar11 = 0;
          }
          uVar9 = uVar11 >> 0x20;
          uVar2 = (uVar11 & 0xffffffff) * local_40;
          uVar12 = uVar2 + uVar9 * local_48;
          lVar6 = 0;
          if (CARRY8(uVar2,uVar9 * local_48)) {
            lVar6 = 0x100000000;
          }
          lVar7 = (uVar11 & 0xffffffff) * uVar10 + uVar9 * local_58;
          uVar2 = uVar11 * local_a8;
          uVar9 = uVar9 * local_40 + uVar2 + (uVar12 >> 0x20) + lVar6 +
                  (ulong)(uVar11 * local_90 < uVar12 << 0x20);
          uVar12 = uVar9 << 0x3d | uVar11 * local_90 >> 3;
          local_b8 = -uVar12;
          local_b0 = ((local_b0 << 0x3d | local_38 >> 3) - (ulong)(uVar12 != 0)) -
                     ((ulong)((uint)(uVar9 < uVar2) +
                             (uint)(uVar2 < (ulong)(lVar7 << 0x20)) +
                             (int)((ulong)lVar7 >> 0x20) +
                             (int)(local_80 >> 0x20) * (int)(uVar11 >> 0x20)) << 0x3d | uVar9 >> 3);
          iVar8 = iVar5 + -0x3d;
          bVar13 = 0x3d < iVar5;
          iVar5 = iVar8;
        } while (bVar13);
      }
      if (iVar8 < -0x3f) {
        local_b8 = local_b8 >> 0xc | local_b0 << 0x34;
        local_b0 = local_b0 >> 0xc;
        local_a0 = local_70 << 0x34 | local_90 >> 0xc;
      }
      else {
        uVar10 = 0xffffffffffffffff;
        if (local_b0 < local_a8) {
          uVar9 = local_80 >> 0x20;
          local_80 = local_98 & 0xffffffff00000000 | 0x8000000000000000;
          uVar11 = 0xffffffff00000000;
          if (local_b0 < local_80) {
            uVar11 = local_b0 / uVar9 << 0x20;
          }
          uVar12 = (local_a8 & 0xffffffff) * (uVar11 >> 0x20);
          uVar2 = uVar11 * local_a8;
          uVar10 = local_b8 - uVar2;
          lVar6 = ((local_b0 - ((uVar12 >> 0x20) + (uVar11 >> 0x20) * uVar9)) -
                  (ulong)(local_b8 < uVar2)) - (ulong)(uVar2 < uVar12 << 0x20);
          if (lVar6 < 0) {
            uVar2 = (0x100000000 - uVar11) * local_a8 + local_b8;
            uVar12 = uVar10;
            do {
              uVar11 = uVar11 - 0x100000000;
              uVar10 = uVar12 + (local_a8 << 0x20);
              bVar13 = uVar2 < uVar12;
              uVar2 = uVar2 + (local_a8 << 0x20);
              lVar6 = lVar6 + uVar9 + (ulong)bVar13;
              uVar12 = uVar10;
            } while (lVar6 < 0);
          }
          uVar10 = uVar10 >> 0x20 | lVar6 << 0x20;
          if (uVar10 < local_80) {
            uVar10 = uVar10 / uVar9;
          }
          else {
            uVar10 = 0xffffffff;
          }
          uVar10 = uVar10 | uVar11;
        }
        uVar11 = 0;
        if (3 < uVar10) {
          uVar11 = uVar10 - 4;
        }
        cVar4 = (char)iVar8;
        uVar11 = uVar11 >> (-cVar4 & 0x3fU);
        local_a0 = local_70 << 0x34 | local_90 >> 0xc;
        bVar3 = (byte)(iVar8 + 0x34);
        if (iVar8 < -0x34) {
          uVar10 = local_b0 << (bVar3 & 0x3f);
          local_b0 = local_b0 >> (-cVar4 - 0x34U & 0x3f);
          uVar10 = local_b8 >> (-cVar4 - 0x34U & 0x3f) | uVar10;
        }
        else {
          uVar10 = local_b8 << (bVar3 & 0x3f);
          if (iVar8 + 0x34 != 0) {
            local_b0 = local_b0 << (bVar3 & 0x3f) | local_b8 >> (0xcU - cVar4 & 0x3f);
          }
        }
        local_b8 = uVar10;
        uVar10 = (local_90 >> 0xc & 0xffffffff) * (uVar11 >> 0x20);
        uVar9 = (uVar11 & 0xffffffff) * (local_a0 >> 0x20);
        lVar6 = 0;
        uVar2 = uVar9 + uVar10;
        if (CARRY8(uVar9,uVar10)) {
          lVar6 = -0x100000000;
        }
        uVar10 = local_a0 * uVar11;
        bVar13 = local_b8 < uVar10;
        local_b8 = local_b8 - uVar10;
        local_b0 = (((lVar6 - ((uVar11 >> 0x20) * (local_a0 >> 0x20) + (local_a8 >> 0xc) * uVar11 +
                              (uVar2 >> 0x20))) - (ulong)(uVar10 < uVar2 << 0x20)) + local_b0) -
                   (ulong)bVar13;
      }
      local_98 = local_a8 >> 0xc;
      uVar10 = local_a0 + local_b8 * 2;
      uVar11 = uVar11 - 1;
      do {
        uVar9 = local_b0;
        uVar10 = uVar10 + local_a0 * -2;
        uVar11 = uVar11 + 1;
        bVar13 = local_b8 < local_a0;
        local_b8 = local_b8 - local_a0;
        local_b0 = (uVar9 - local_98) - (ulong)bVar13;
      } while (-1 < (long)local_b0);
      lVar6 = local_b0 + uVar9 + (ulong)(uVar10 < local_b8);
      if ((lVar6 < 0) || ((uVar11 & 1) == 0 && (lVar6 == 0 && uVar10 == 0))) {
        local_b8 = local_a0 + local_b8;
        local_b0 = uVar9;
      }
      uVar11 = local_b0;
      if ((long)local_b0 < 0) {
        bVar13 = local_b8 != 0;
        local_b8 = -local_b8;
        local_b0 = -local_b0 - (ulong)bVar13;
      }
      local_68 = a.high;
      local_50 = status;
      a = normalizeRoundAndPackFloat128
                    ((byte)((byte)(uVar11 >> 0x38) ^ a.high._7_1_) >> 7,local_88 - 4,local_b0,
                     local_b8,status);
    }
  }
  return a;
}

Assistant:

float128 float128_rem(float128 a, float128 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig0, bSig1, q, term0, term1, term2;
    uint64_t allZero, alternateASig0, alternateASig1, sigMean1;
    int64_t sigMean0;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        goto invalid;
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return a;
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    expDiff = aExp - bExp;
    if ( expDiff < -1 ) return a;
    shortShift128Left(
        aSig0 | UINT64_C(0x0001000000000000),
        aSig1,
        15 - ( expDiff < 0 ),
        &aSig0,
        &aSig1
    );
    shortShift128Left(
        bSig0 | UINT64_C(0x0001000000000000), bSig1, 15, &bSig0, &bSig1 );
    q = le128( bSig0, bSig1, aSig0, aSig1 );
    if ( q ) sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    expDiff -= 64;
    while ( 0 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        shortShift192Left( term0, term1, term2, 61, &term1, &term2, &allZero );
        shortShift128Left( aSig0, aSig1, 61, &aSig0, &allZero );
        sub128( aSig0, 0, term1, term2, &aSig0, &aSig1 );
        expDiff -= 61;
    }
    if ( -64 < expDiff ) {
        q = estimateDiv128To64( aSig0, aSig1, bSig0 );
        q = ( 4 < q ) ? q - 4 : 0;
        q >>= - expDiff;
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
        expDiff += 52;
        if ( expDiff < 0 ) {
            shift128Right( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
        }
        else {
            shortShift128Left( aSig0, aSig1, expDiff, &aSig0, &aSig1 );
        }
        mul128By64To192( bSig0, bSig1, q, &term0, &term1, &term2 );
        sub128( aSig0, aSig1, term1, term2, &aSig0, &aSig1 );
    }
    else {
        shift128Right( aSig0, aSig1, 12, &aSig0, &aSig1 );
        shift128Right( bSig0, bSig1, 12, &bSig0, &bSig1 );
    }
    do {
        alternateASig0 = aSig0;
        alternateASig1 = aSig1;
        ++q;
        sub128( aSig0, aSig1, bSig0, bSig1, &aSig0, &aSig1 );
    } while ( 0 <= (int64_t) aSig0 );
    add128(
        aSig0, aSig1, alternateASig0, alternateASig1, (uint64_t *)&sigMean0, &sigMean1 );
    if (    ( sigMean0 < 0 )
         || ( ( ( sigMean0 | sigMean1 ) == 0 ) && ( q & 1 ) ) ) {
        aSig0 = alternateASig0;
        aSig1 = alternateASig1;
    }
    zSign = ( (int64_t) aSig0 < 0 );
    if ( zSign ) sub128( 0, 0, aSig0, aSig1, &aSig0, &aSig1 );
    return normalizeRoundAndPackFloat128(aSign ^ zSign, bExp - 4, aSig0, aSig1,
                                         status);
}